

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O3

bool __thiscall cmInstalledFile::GetProperty(cmInstalledFile *this,string *prop,string *value)

{
  _Base_ptr p_Var1;
  const_iterator cVar2;
  _Rb_tree_header *p_Var3;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> *ve
  ;
  _Base_ptr p_Var4;
  string separator;
  string output;
  undefined1 *local_80;
  char *local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  _Base_ptr local_40;
  string *local_38;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>_>
          ::find(&(this->Properties)._M_t,prop);
  p_Var3 = &(this->Properties)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar2._M_node != p_Var3) {
    local_60 = &local_50;
    local_58 = 0;
    local_50 = 0;
    local_80 = &local_70;
    local_78 = (char *)0x0;
    local_70 = 0;
    p_Var4 = *(_Base_ptr *)(cVar2._M_node + 2);
    p_Var1 = cVar2._M_node[2]._M_parent;
    local_40 = cVar2._M_node;
    local_38 = value;
    if (p_Var4 != p_Var1) {
      do {
        std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_80);
        std::__cxx11::string::_M_append((char *)&local_60,*(ulong *)(*(long *)p_Var4 + 0x28));
        std::__cxx11::string::_M_replace((ulong)&local_80,0,local_78,0x7465e0);
        p_Var4 = (_Base_ptr)&p_Var4->_M_parent;
      } while (p_Var4 != p_Var1);
    }
    std::__cxx11::string::_M_assign((string *)local_38);
    cVar2._M_node = local_40;
    if (local_80 != &local_70) {
      operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
    }
    if (local_60 != &local_50) {
      operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
    }
  }
  return (_Rb_tree_header *)cVar2._M_node != p_Var3;
}

Assistant:

bool cmInstalledFile::GetProperty(const std::string& prop,
                                  std::string& value) const
{
  auto i = this->Properties.find(prop);
  if (i == this->Properties.end()) {
    return false;
  }

  Property const& property = i->second;

  std::string output;
  std::string separator;

  for (const auto& ve : property.ValueExpressions) {
    output += separator;
    output += ve->GetInput();
    separator = ";";
  }

  value = output;
  return true;
}